

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O2

int pem_write_bio_DSAparams_i2d(void *x,uchar **outp)

{
  int iVar1;
  CBB CStack_40;
  
  iVar1 = CBB_init(&CStack_40,0);
  if ((iVar1 != 0) && (iVar1 = DSA_marshal_parameters(&CStack_40,(DSA *)x), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d(&CStack_40,outp);
    return iVar1;
  }
  CBB_cleanup(&CStack_40);
  return -1;
}

Assistant:

static EC_KEY *pkey_get_eckey(EVP_PKEY *key, EC_KEY **eckey) {
  EC_KEY *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_EC_KEY(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (eckey) {
    EC_KEY_free(*eckey);
    *eckey = dtmp;
  }
  return dtmp;
}